

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O1

S2CellId __thiscall S2CellId::child_begin(S2CellId *this,int level)

{
  ulong uVar1;
  ulong uVar2;
  S2LogMessage SStack_18;
  
  uVar1 = this->id_;
  if (((uint)(uVar1 >> 0x3e) < 3) && ((uVar1 & 0x1555555555555555 & -uVar1) != 0)) {
    uVar1 = this->id_;
    if (uVar1 == 0) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x223,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: id_ != 0 ",0x17);
    }
    else {
      uVar2 = 0;
      if (uVar1 != 0) {
        for (; (uVar1 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (level < (int)(0x1e - ((uint)(uVar2 >> 1) & 0x7fffffff))) {
        S2LogMessage::S2LogMessage
                  (&SStack_18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                   ,0x284,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_18.stream_,"Check failed: (level) >= (this->level()) ",0x29);
      }
      else {
        if (level < 0x1f) {
          return (S2CellId)((1L << ((char)level * -2 + 0x3cU & 0x3f)) + (this->id_ - 1 & this->id_))
          ;
        }
        S2LogMessage::S2LogMessage
                  (&SStack_18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                   ,0x285,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_18.stream_,"Check failed: (level) <= (kMaxLevel) ",0x25);
      }
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x283,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: is_valid() ",0x19);
  }
  abort();
}

Assistant:

inline int S2CellId::face() const {
  return id_ >> kPosBits;
}